

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
          (Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *this,
          Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *other)

{
  NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client> *other_00;
  Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *other_local;
  Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *this_local;
  
  other_00 = mv<kj::_::NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client>>
                       (&other->ptr);
  kj::_::NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client>::NullableValue
            (&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }